

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O0

string * __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::getSpecializedVSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderInvalidArrayedInputVariablesTest *this)

{
  char *local_58;
  char *vs_code_raw;
  allocator<char> local_39;
  string local_38 [8];
  string vs_code;
  GeometryShaderInvalidArrayedInputVariablesTest *this_local;
  string *specialized_vs_code;
  
  vs_code.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,
             "${VERSION}\n\nout vec4 data;\n\nvoid main()\n{\n    data = vec4(gl_VertexID, 0, 0, 1);\n}\n"
             ,&local_39);
  std::allocator<char>::~allocator(&local_39);
  local_58 = (char *)std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            (__return_storage_ptr__,&this->super_TestCaseBase,1,&local_58);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderInvalidArrayedInputVariablesTest::getSpecializedVSCode() const
{
	std::string vs_code = "${VERSION}\n"
						  "\n"
						  "out vec4 data;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    data = vec4(gl_VertexID, 0, 0, 1);\n"
						  "}\n";
	const char* vs_code_raw			= vs_code.c_str();
	std::string specialized_vs_code = specializeShader(1, /* parts */
													   &vs_code_raw);

	return specialized_vs_code;
}